

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

ostream * operator<<(ostream *str,ArchiveEntry *data)

{
  ostream *poVar1;
  ArchiveEntry *data_local;
  ostream *str_local;
  
  poVar1 = std::operator<<(str,(string *)data);
  std::operator<<(poVar1,",");
  poVar1 = std::operator<<(str,(string *)&data->RunName);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,(bool)(data->Failure & 1));
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->ExperimentValue);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->ExperimentValueScale);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->FirstRanDate);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->TotalSamplesCollected);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->AverageBaseline);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->MinBaseline);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->MinBaseline_TimeSinceEpoch);
  std::operator<<(poVar1,",");
  poVar1 = operator<<(str,&data->MinStats);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->MaxBaseline);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->MaxBaseline_TimeSinceEpoch);
  std::operator<<(poVar1,",");
  poVar1 = operator<<(str,&data->MaxStats);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->CurrentBaseline);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(str,data->CurrentBaseline_TimeSinceEpoch);
  std::operator<<(poVar1,",");
  poVar1 = operator<<(str,&data->CurrentStats);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, ArchiveEntry const& data)
{
	str << data.GroupName << ",";
	str << data.RunName << ",";
	str << data.Failure << ",";
	str << data.ExperimentValue << ",";
	str << data.ExperimentValueScale << ",";
	str << data.FirstRanDate << ",";
	str << data.TotalSamplesCollected << ",";
	str << data.AverageBaseline << ",";
	str << data.MinBaseline << ",";
	str << data.MinBaseline_TimeSinceEpoch << ",";
	str << data.MinStats << ",";
	str << data.MaxBaseline << ",";
	str << data.MaxBaseline_TimeSinceEpoch << ",";
	str << data.MaxStats << ",";
	str << data.CurrentBaseline << ",";
	str << data.CurrentBaseline_TimeSinceEpoch << ",";
	str << data.CurrentStats << std::endl;
	return str;
}